

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng.c
# Opt level: O1

void light_pcapng_historgram
               (light_pcapng pcapng,_func_uint32_t_light_pcapng *key_master,light_pair **hist,
               size_t *size,size_t *rejected)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  light_pair *plVar3;
  size_t sVar4;
  size_t sVar5;
  size_t local_48;
  
  *hist = (light_pair *)0x0;
  if (pcapng == (light_pcapng)0x0) {
    local_48 = 0;
    sVar5 = 0;
  }
  else {
    sVar5 = 0;
    local_48 = 0;
    do {
      uVar2 = (*key_master)(pcapng);
      if (uVar2 == 0xffffffff) {
        local_48 = local_48 + 1;
      }
      else {
        if (sVar5 != 0) {
          sVar4 = 0;
          do {
            if ((*hist)[sVar4].key == uVar2) {
              puVar1 = &(*hist)[sVar4].val;
              *puVar1 = *puVar1 + 1;
              goto LAB_0010330e;
            }
            sVar4 = sVar4 + 1;
          } while (sVar5 != sVar4);
        }
        plVar3 = (light_pair *)realloc(*hist,sVar5 * 8 + 8);
        *hist = plVar3;
        plVar3[sVar5].key = uVar2;
        plVar3[sVar5].val = 1;
        sVar5 = sVar5 + 1;
      }
LAB_0010330e:
      pcapng = pcapng->next_block;
    } while (pcapng != (_light_pcapng *)0x0);
  }
  *size = sVar5;
  if (rejected != (size_t *)0x0) {
    *rejected = local_48;
  }
  return;
}

Assistant:

void light_pcapng_historgram(const light_pcapng pcapng, uint32_t (*key_master)(const light_pcapng),
		light_pair **hist, size_t *size, size_t *rejected)
{
	light_pcapng iterator = pcapng;
	size_t dropped = 0;
	size_t sz = 0;
	size_t i;

	*hist = NULL;

	while (iterator != NULL) {
		uint32_t key = key_master(iterator);
		if (key != LIGHT_KEY_REJECTED) {
			int found = 0;
			for (i = 0; i < sz; ++i) {
				if ((*hist)[i].key == key) {
					found = 1;
					(*hist)[i].val++;
					break;
				}
			}

			if (found == 0) {
				*hist = realloc(*hist, (sz + 1) * sizeof(light_pair));
				(*hist)[sz].key = key;
				(*hist)[sz].val = 1;
				sz++;
			}
		}
		else {
			dropped++;
		}
		iterator = iterator->next_block;
	}

	*size = sz;

	if (rejected != NULL)
		*rejected = dropped;
}